

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<int,int>::insert<int&,int&>(HighsHashTable<int,_int> *this,int *args,int *args_1)

{
  ulong uVar1;
  bool bVar2;
  pointer pHVar3;
  type puVar4;
  ulong uVar5;
  u64 uVar6;
  u64 uVar7;
  HighsHashTableEntry<int,_int> *in_RDX;
  HighsHashTable<int,_int> *in_RSI;
  HighsHashTable<int,_int> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry *entryArray;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry entry;
  u64 *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  uchar local_41;
  HighsHashTable<int,_int> *in_stack_ffffffffffffffc0;
  u64 *in_stack_ffffffffffffffc8;
  HighsHashTable<int,_int> *in_stack_ffffffffffffffd0;
  HighsHashTableEntry<int,_int> in_stack_ffffffffffffffd8;
  bool local_1;
  
  HighsHashTableEntry<int,int>::HighsHashTableEntry<int&,int&>
            ((HighsHashTableEntry<int,int> *)&stack0xffffffffffffffd8,(int *)in_RSI,&in_RDX->key_);
  HighsHashTableEntry<int,_int>::key((HighsHashTableEntry<int,_int> *)&stack0xffffffffffffffd8);
  bVar2 = HighsHashTable<int,_int>::findPosition
                    (in_RSI,&in_RDX->key_,(u8 *)in_stack_ffffffffffffffd8,
                     (u64 *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (u64 *)in_stack_ffffffffffffffc0);
  if (bVar2) {
    local_1 = false;
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffd0 == in_stack_ffffffffffffffc0)) {
    HighsHashTable<int,_int>::growTable(in_stack_ffffffffffffffd0);
    local_1 = insert<HighsHashTableEntry<int,int>>(in_RSI,in_RDX);
  }
  else {
    pHVar3 = std::unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
             ::get((unique_ptr<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                    *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          (size_t)in_stack_ffffffffffffff88);
      bVar2 = HighsHashTable<int,_int>::occupied(in_RDI,*puVar4);
      if (!bVar2) {
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(local_41,in_stack_ffffffffffffff90),
                            (size_t)in_stack_ffffffffffffff88);
        *puVar4 = local_41;
        pHVar3[(long)in_stack_ffffffffffffffd0] = in_stack_ffffffffffffffd8;
        return true;
      }
      uVar5 = (long)in_stack_ffffffffffffffd0 - (long)in_stack_ffffffffffffffc8;
      uVar1 = in_RDI->tableSizeMask;
      uVar6 = HighsHashTable<int,_int>::distanceFromIdealSlot
                        ((HighsHashTable<int,_int> *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         (u64)in_stack_ffffffffffffff88);
      if (uVar6 < (uVar5 & uVar1)) {
        std::swap<HighsHashTableEntry<int,int>>
                  ((HighsHashTableEntry<int,_int> *)&stack0xffffffffffffffd8,
                   pHVar3 + (long)in_stack_ffffffffffffffd0);
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            (size_t)in_stack_ffffffffffffff88);
        std::swap<unsigned_char>(&local_41,puVar4);
        in_stack_ffffffffffffff88 =
             (u64 *)((long)in_stack_ffffffffffffffd0 - uVar6 & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffff88;
        uVar7 = HighsHashTable<int,_int>::maxDistance();
        in_stack_ffffffffffffffc0 =
             (HighsHashTable<int,_int> *)
             ((long)in_stack_ffffffffffffff88 + uVar7 & in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffd0 =
           (HighsHashTable<int,_int> *)
           ((ulong)((long)&(in_stack_ffffffffffffffd0->entries)._M_t.
                           super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
                           .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>.
                           _M_head_impl + 1U) & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffd0 != in_stack_ffffffffffffffc0);
    HighsHashTable<int,_int>::growTable(in_stack_ffffffffffffffd0);
    insert<HighsHashTableEntry<int,int>>(in_RSI,in_RDX);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }